

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O2

bool gmlc::networking::isIpv6(string *address)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar1;
  difference_type dVar2;
  size_type sVar3;
  bool bVar4;
  undefined1 local_11;
  
  __first._M_current = (address->_M_dataplus)._M_p;
  dVar2 = std::
          __count_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(__first._M_current + address->_M_string_length),
                     (_Iter_equals_val<const_char>)&local_11);
  bVar4 = true;
  if (dVar2 < 3) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (address,'[',0);
    if (sVar3 == 0xffffffffffffffff) {
      iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,0
                      ,2,"::");
      bVar4 = iVar1 == 0;
    }
  }
  return bVar4;
}

Assistant:

bool isIpv6(const std::string& address)
{
    auto cntcolon = std::count(address.begin(), address.end(), ':');
    if (cntcolon > 2) {
        return true;
    }

    auto brkcnt = address.find_first_of('[');
    if (brkcnt != std::string::npos) {
        return true;
    }
    if (address.compare(0, 2, "::") == 0) {
        return true;
    }
    return false;
}